

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDForceModifier.cpp
# Opt level: O2

void __thiscall OpenMD::LDForceModifier::LDForceModifier(LDForceModifier *this,SimInfo *info)

{
  SimInfo **ppSVar1;
  _Rb_tree_header *p_Var2;
  vector<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_> *this_00;
  _Rb_tree_header *p_Var3;
  vector<OpenMD::MomentData_*,_std::allocator<OpenMD::MomentData_*>_> *this_01;
  unique_ptr<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_> *puVar4;
  pointer *pppAVar5;
  Velocitizer *pVVar6;
  pointer ppSVar7;
  HydroProp *this_02;
  RealType RVar8;
  double dVar9;
  undefined8 uVar10;
  bool bVar11;
  int iVar12;
  Molecule *pMVar13;
  Ellipsoid *this_03;
  Globals *pGVar14;
  undefined4 extraout_var;
  HydroIO *this_04;
  iterator iVar15;
  pointer ppSVar16;
  StuntDouble *pSVar17;
  pointer ppAVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  HydroProp *currHydroProp;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::HydroProp*>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::HydroProp*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::HydroProp*>>>
  *local_188;
  MoleculeIterator i;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> atChain;
  LennardJonesAdapter lja;
  undefined1 local_128 [16];
  undefined1 local_118 [64];
  double local_d8;
  double local_d0;
  Molecule *local_c8;
  Vector<double,_3U> local_c0;
  Vector<double,_3U> local_a8;
  Vector<double,_3U> local_90;
  RectMatrix<double,_3U,_3U> local_78;
  
  ppSVar1 = &(this->super_ForceModifier).info_;
  (this->super_ForceModifier).info_ = info;
  (this->super_ForceModifier)._vptr_ForceModifier = (_func_int **)&PTR__LDForceModifier_002bbd00;
  (this->hydroPropMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_188 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::HydroProp*>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::HydroProp*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::HydroProp*>>>
               *)&this->hydroPropMap_;
  (this->hydroPropMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var2 = &(this->hydroPropMap_)._M_t._M_impl.super__Rb_tree_header;
  (this->hydroPropMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->hydroPropMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  this_00 = &this->hydroProps_;
  p_Var3 = &(this->momentsMap_)._M_t._M_impl.super__Rb_tree_header;
  (this->momentsMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->momentsMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->hydroPropMap_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->hydroProps_).super__Vector_base<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->hydroProps_).super__Vector_base<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->hydroProps_).super__Vector_base<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->momentsMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (this->momentsMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  this_01 = &this->moments_;
  (this->momentsMap_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->moments_).super__Vector_base<OpenMD::MomentData_*,_std::allocator<OpenMD::MomentData_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->moments_).super__Vector_base<OpenMD::MomentData_*,_std::allocator<OpenMD::MomentData_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->moments_).super__Vector_base<OpenMD::MomentData_*,_std::allocator<OpenMD::MomentData_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->maxIterNum_ = 6;
  this->forceTolerance_ = 1e-06;
  std::__shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->randNumGen_).
              super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>,
             &(info->randNumGen_).
              super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>);
  *(undefined4 *)&(this->forceDistribution_)._M_param._M_mean = 0;
  *(undefined4 *)((long)&(this->forceDistribution_)._M_param._M_mean + 4) = 0;
  *(undefined4 *)&(this->forceDistribution_)._M_param._M_stddev = 0;
  *(undefined4 *)((long)&(this->forceDistribution_)._M_param._M_stddev + 4) = 0x3ff00000;
  (this->forceDistribution_)._M_saved = 0.0;
  (this->forceDistribution_)._M_saved_available = false;
  pGVar14 = info->simParams_;
  this->simParams_ = pGVar14;
  puVar4 = &this->veloMunge_;
  (this->veloMunge_)._M_t.
  super___uniq_ptr_impl<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_>._M_t.
  super__Tuple_impl<0UL,_OpenMD::Velocitizer_*,_std::default_delete<OpenMD::Velocitizer>_>.
  super__Head_base<0UL,_OpenMD::Velocitizer_*,_false>._M_head_impl = (Velocitizer *)0x0;
  local_d8 = (pGVar14->Dt).data_;
  this->dt2_ = local_d8 * 0.5;
  local_118._56_8_ = puVar4;
  std::make_unique<OpenMD::Velocitizer,OpenMD::SimInfo*&>((SimInfo **)local_128);
  uVar10 = local_128._0_8_;
  local_128._0_8_ = (SimInfo *)0x0;
  pVVar6 = (puVar4->_M_t).
           super___uniq_ptr_impl<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_>.
           _M_t.
           super__Tuple_impl<0UL,_OpenMD::Velocitizer_*,_std::default_delete<OpenMD::Velocitizer>_>.
           super__Head_base<0UL,_OpenMD::Velocitizer_*,_false>._M_head_impl;
  (puVar4->_M_t).
  super___uniq_ptr_impl<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_>._M_t.
  super__Tuple_impl<0UL,_OpenMD::Velocitizer_*,_std::default_delete<OpenMD::Velocitizer>_>.
  super__Head_base<0UL,_OpenMD::Velocitizer_*,_false>._M_head_impl = (Velocitizer *)uVar10;
  if ((pVVar6 != (Velocitizer *)0x0) &&
     ((*pVVar6->_vptr_Velocitizer[1])(), (SimInfo *)local_128._0_8_ != (SimInfo *)0x0)) {
    (**(code **)(*(long *)local_128._0_8_ + 8))();
  }
  this->sphericalBoundaryConditions_ = false;
  pGVar14 = this->simParams_;
  if ((pGVar14->UseSphericalBoundaryConditions).super_ParameterBase.field_0x2b == '\x01') {
    this->sphericalBoundaryConditions_ = true;
    if ((pGVar14->LangevinBufferRadius).super_ParameterBase.empty_ == false) {
      this->langevinBufferRadius_ = (pGVar14->LangevinBufferRadius).data_;
    }
    else {
      memcpy(&painCave,
             "langevinBufferRadius must be specified when useSphericalBoundaryConditions is turned on.\n"
             ,0x5a);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
      pGVar14 = this->simParams_;
    }
    if ((pGVar14->FrozenBufferRadius).super_ParameterBase.empty_ == false) {
      dVar9 = (pGVar14->FrozenBufferRadius).data_;
      uVar19 = SUB84(dVar9,0);
      uVar20 = (undefined4)((ulong)dVar9 >> 0x20);
      this->frozenBufferRadius_ = dVar9;
    }
    else {
      memcpy(&painCave,
             "frozenBufferRadius must be specified when useSphericalBoundaryConditions is turned on.\n"
             ,0x58);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
      uVar19 = SUB84(this->frozenBufferRadius_,0);
      uVar20 = (undefined4)((ulong)this->frozenBufferRadius_ >> 0x20);
    }
    if ((double)CONCAT44(uVar20,uVar19) <= this->langevinBufferRadius_ &&
        this->langevinBufferRadius_ != (double)CONCAT44(uVar20,uVar19)) {
      memcpy(&painCave,
             "frozenBufferRadius has been set smaller than the langevinBufferRadius.  This is probably an error.\n"
             ,100);
      painCave.isFatal = 0;
      painCave.severity = 2;
      simError();
    }
  }
  i._M_node = (_Base_ptr)0x0;
  pMVar13 = SimInfo::beginMolecule(*ppSVar1,&i);
  bVar11 = false;
  while (pMVar13 != (Molecule *)0x0) {
    ppSVar16 = (pMVar13->integrableObjects_).
               super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppSVar7 = (pMVar13->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppSVar16 != ppSVar7) goto LAB_001b106a;
    pSVar17 = (StuntDouble *)0x0;
    while (pSVar17 != (StuntDouble *)0x0) {
      if (pSVar17->objType_ == otRigidBody) {
        bVar11 = (bool)(bVar11 | 8U < (ulong)((long)pSVar17[2].properties_._vptr_PropertyMap -
                                             (long)pSVar17[2].mass_));
      }
      ppSVar16 = ppSVar16 + 1;
      pSVar17 = (StuntDouble *)0x0;
      if (ppSVar16 != ppSVar7) {
LAB_001b106a:
        pSVar17 = *ppSVar16;
      }
    }
    pMVar13 = SimInfo::nextMolecule(*ppSVar1,&i);
  }
  if (bVar11) {
    if ((this->simParams_->HydroPropFile).super_ParameterBase.empty_ == false) {
      this_04 = (HydroIO *)operator_new(0xc0);
      HydroIO::HydroIO(this_04);
      std::__cxx11::string::string
                ((string *)&atChain,(string *)&(this->simParams_->HydroPropFile).data_);
      HydroIO::parseHydroFile
                ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
                  *)local_128,this_04,(string *)&atChain);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
      ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
                   *)local_188,
                  (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
                   *)local_128);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
                   *)local_128);
      std::__cxx11::string::~string((string *)&atChain);
    }
    else {
      memcpy(&painCave,
             "HydroPropFile must be set to a file name if Langevin Dynamics\n\tis specified for rigidBodies which contain more than one atom\n\tTo create a HydroPropFile, run the \"Hydro\" program.\n"
             ,0xb3);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
    pMVar13 = SimInfo::beginMolecule(*ppSVar1,&i);
    while (pMVar13 != (Molecule *)0x0) {
      ppSVar16 = (pMVar13->integrableObjects_).
                 super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if (ppSVar16 !=
          (pMVar13->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) goto LAB_001b16cc;
      pSVar17 = (StuntDouble *)0x0;
      while (pSVar17 != (StuntDouble *)0x0) {
        (*pSVar17->_vptr_StuntDouble[7])((key_type *)local_128,pSVar17);
        iVar15 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
                         *)local_188,(key_type *)local_128);
        std::__cxx11::string::~string((string *)local_128);
        if ((_Rb_tree_header *)iVar15._M_node == p_Var2) {
          (*pSVar17->_vptr_StuntDouble[7])((key_type *)local_128,pSVar17);
          snprintf(painCave.errMsg,2000,"Can not find resistance tensor for atom [%s]\n",
                   local_128._0_8_);
          std::__cxx11::string::~string((string *)local_128);
          painCave.isFatal = 1;
          painCave.severity = 1;
          simError();
        }
        else {
          std::vector<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_>::push_back
                    (this_00,(value_type *)(iVar15._M_node + 2));
          local_128._0_8_ = getMomentData(this,pSVar17);
          std::vector<OpenMD::MomentData*,std::allocator<OpenMD::MomentData*>>::
          emplace_back<OpenMD::MomentData*>
                    ((vector<OpenMD::MomentData*,std::allocator<OpenMD::MomentData*>> *)this_01,
                     (MomentData **)local_128);
        }
        ppSVar16 = ppSVar16 + 1;
        pSVar17 = (StuntDouble *)0x0;
        if (ppSVar16 !=
            (pMVar13->integrableObjects_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
LAB_001b16cc:
          pSVar17 = *ppSVar16;
        }
      }
      pMVar13 = SimInfo::nextMolecule(*ppSVar1,&i);
    }
  }
  else {
    pMVar13 = SimInfo::beginMolecule(*ppSVar1,&i);
    while (pMVar13 != (Molecule *)0x0) {
      ppSVar16 = (pMVar13->integrableObjects_).
                 super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      local_c8 = pMVar13;
      if (ppSVar16 !=
          (pMVar13->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) goto LAB_001b154a;
      pSVar17 = (StuntDouble *)0x0;
      while (pSVar17 != (StuntDouble *)0x0) {
        if (pSVar17->objType_ < otRigidBody) {
          this_02 = (HydroProp *)pSVar17[1]._vptr_StuntDouble;
          currHydroProp = this_02;
          bVar11 = GayBerneAdapter::isGayBerne((GayBerneAdapter *)&currHydroProp);
          if (bVar11) {
            this_03 = (Ellipsoid *)operator_new(0xa8);
            Vector<double,_3U>::Vector(&local_90,(Vector<double,_3U> *)OpenMD::V3Zero);
            RVar8 = GayBerneAdapter::getL((GayBerneAdapter *)&currHydroProp);
            local_d0 = RVar8 * 0.5;
            RVar8 = GayBerneAdapter::getD((GayBerneAdapter *)&currHydroProp);
            SquareMatrix<double,_3>::identity();
            RectMatrix<double,_3U,_3U>::operator=(&local_78,(RectMatrix<double,_3U,_3U> *)local_128)
            ;
            Ellipsoid::Ellipsoid
                      (this_03,(Vector3d *)&local_90,local_d0,RVar8 * 0.5,(Mat3x3d *)&local_78);
          }
          else {
            lja.at_ = (AtomType *)this_02;
            bVar11 = LennardJonesAdapter::isLennardJones(&lja);
            if (bVar11) {
              this_03 = (Ellipsoid *)operator_new(0x48);
              Vector<double,_3U>::Vector(&local_a8,(Vector<double,_3U> *)OpenMD::V3Zero);
              RVar8 = LennardJonesAdapter::getSigma(&lja);
              Sphere::Sphere((Sphere *)this_03,(Vector3d *)&local_a8,RVar8 * 0.5);
            }
            else {
              AtomType::allYourBase(&atChain,(AtomType *)this_02);
              ppAVar18 = atChain.
                         super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              do {
                if (ppAVar18 ==
                    atChain.
                    super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
                  builtin_strncpy(painCave.errMsg + 0x20,"ult element.txt\n",0x11);
                  builtin_strncpy(painCave.errMsg + 0x10,"tom type in defa",0x10);
                  builtin_strncpy(painCave.errMsg,"Could not find a",0x10);
                  painCave.isFatal = 1;
                  painCave.severity = 1;
                  simError();
                  this_03 = (Ellipsoid *)0x0;
                  goto LAB_001b11e6;
                }
                AtomType::getName_abi_cxx11_((string *)local_128,*ppAVar18);
                iVar12 = ElementsTable::GetAtomicNum((ElementsTable *)etab,(char *)local_128._0_8_);
                std::__cxx11::string::~string((string *)local_128);
                ppAVar18 = ppAVar18 + 1;
              } while (iVar12 == 0);
              this_03 = (Ellipsoid *)operator_new(0x48);
              Vector<double,_3U>::Vector(&local_c0,(Vector<double,_3U> *)OpenMD::V3Zero);
              RVar8 = ElementsTable::GetVdwRad((ElementsTable *)etab,iVar12);
              Sphere::Sphere((Sphere *)this_03,(Vector3d *)&local_c0,RVar8);
LAB_001b11e6:
              std::_Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::
              ~_Vector_base(&atChain.
                             super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                           );
            }
          }
        }
        else {
          this_03 = (Ellipsoid *)0x0;
        }
        pGVar14 = this->simParams_;
        if ((pGVar14->TargetTemp).super_ParameterBase.empty_ == true) {
          builtin_strncpy(painCave.errMsg,"You can\'t use LangevinDynamics without a targetTemp!\n",
                          0x36);
          painCave.isFatal = 1;
          painCave.severity = 1;
          simError();
          pGVar14 = this->simParams_;
        }
        if ((pGVar14->Viscosity).super_ParameterBase.empty_ == true) {
          builtin_strncpy(painCave.errMsg,"You can\'t use LangevinDynamics without a viscosity!\n",
                          0x35);
          painCave.isFatal = 1;
          painCave.severity = 1;
          simError();
          pGVar14 = this->simParams_;
        }
        iVar12 = (*(this_03->super_Shape)._vptr_Shape[5])
                           (SUB84((pGVar14->Viscosity).data_,0),this_03);
        currHydroProp = (HydroProp *)CONCAT44(extraout_var,iVar12);
        (*pSVar17->_vptr_StuntDouble[7])
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>
                    *)local_128,pSVar17);
        iVar15 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
                         *)local_188,(key_type *)local_128);
        std::__cxx11::string::~string((string *)local_128);
        if ((_Rb_tree_header *)iVar15._M_node == p_Var2) {
          HydroProp::complete(currHydroProp);
          (*pSVar17->_vptr_StuntDouble[7])(&atChain,pSVar17);
          local_128._8_8_ =
               atChain.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          local_128._0_8_ = local_118;
          pppAVar5 = &atChain.
                      super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage;
          if (atChain.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)pppAVar5) {
            local_128._0_8_ =
                 atChain.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
          }
          local_118._1_7_ =
               atChain.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage._1_7_;
          local_118[0] = atChain.
                         super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_;
          atChain.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          atChain.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          local_118._16_8_ = currHydroProp;
          atChain.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)pppAVar5;
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::HydroProp*>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::HydroProp*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::HydroProp*>>>
          ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::HydroProp*>>
                    (local_188,
                     (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>
                      *)local_128);
          std::__cxx11::string::~string((string *)local_128);
          std::__cxx11::string::~string((string *)&atChain);
          std::vector<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_>::push_back
                    (this_00,&currHydroProp);
          local_128._0_8_ = getMomentData(this,pSVar17);
          std::vector<OpenMD::MomentData*,std::allocator<OpenMD::MomentData*>>::
          emplace_back<OpenMD::MomentData*>
                    ((vector<OpenMD::MomentData*,std::allocator<OpenMD::MomentData*>> *)this_01,
                     (MomentData **)local_128);
        }
        else {
          std::vector<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_>::push_back
                    (this_00,(value_type *)(iVar15._M_node + 2));
          local_128._0_8_ = getMomentData(this,pSVar17);
          std::vector<OpenMD::MomentData*,std::allocator<OpenMD::MomentData*>>::
          emplace_back<OpenMD::MomentData*>
                    ((vector<OpenMD::MomentData*,std::allocator<OpenMD::MomentData*>> *)this_01,
                     (MomentData **)local_128);
        }
        (*(this_03->super_Shape)._vptr_Shape[1])(this_03);
        ppSVar16 = ppSVar16 + 1;
        pSVar17 = (StuntDouble *)0x0;
        if (ppSVar16 !=
            (local_c8->integrableObjects_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
LAB_001b154a:
          pSVar17 = *ppSVar16;
        }
      }
      pMVar13 = SimInfo::nextMolecule(*ppSVar1,&i);
    }
  }
  dVar9 = ((this->simParams_->TargetTemp).data_ * 0.0039744312) / local_d8;
  if (dVar9 < 0.0) {
    dVar9 = sqrt(dVar9);
  }
  else {
    dVar9 = SQRT(dVar9);
  }
  (this->forceDistribution_)._M_param._M_mean = 0.0;
  (this->forceDistribution_)._M_param._M_stddev = dVar9;
  (this->forceDistribution_)._M_saved = 0.0;
  (this->forceDistribution_)._M_saved_available = false;
  return;
}

Assistant:

LDForceModifier::LDForceModifier(SimInfo* info) :
      ForceModifier {info}, maxIterNum_ {6}, forceTolerance_ {1e-6},
      randNumGen_ {info->getRandomNumberGenerator()},
      simParams_ {info->getSimParams()} {
    RealType dt = simParams_->getDt();
    dt2_        = dt * 0.5;

    veloMunge_ = std::make_unique<Velocitizer>(info_);

    sphericalBoundaryConditions_ = false;
    if (simParams_->getUseSphericalBoundaryConditions()) {
      sphericalBoundaryConditions_ = true;
      if (simParams_->haveLangevinBufferRadius()) {
        langevinBufferRadius_ = simParams_->getLangevinBufferRadius();
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "langevinBufferRadius must be specified "
                 "when useSphericalBoundaryConditions is turned on.\n");
        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
      }

      if (simParams_->haveFrozenBufferRadius()) {
        frozenBufferRadius_ = simParams_->getFrozenBufferRadius();
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "frozenBufferRadius must be specified "
                 "when useSphericalBoundaryConditions is turned on.\n");
        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
      }

      if (frozenBufferRadius_ < langevinBufferRadius_) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "frozenBufferRadius has been set smaller than the "
                 "langevinBufferRadius.  This is probably an error.\n");
        painCave.severity = OPENMD_WARNING;
        painCave.isFatal  = 0;
        simError();
      }
    }

    // Build the hydroProp_ map:
    Molecule* mol;
    StuntDouble* sd;
    SimInfo::MoleculeIterator i;
    Molecule::IntegrableObjectIterator j;
    bool needHydroPropFile = false;

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        if (sd->isRigidBody()) {
          RigidBody* rb = static_cast<RigidBody*>(sd);
          if (rb->getNumAtoms() > 1) needHydroPropFile = true;
        }
      }
    }

    if (needHydroPropFile) {
      if (simParams_->haveHydroPropFile()) {
        HydroIO* hio  = new HydroIO();
        hydroPropMap_ = hio->parseHydroFile(simParams_->getHydroPropFile());
      } else {
        snprintf(
            painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
            "HydroPropFile must be set to a file name if Langevin Dynamics\n"
            "\tis specified for rigidBodies which contain more than one atom\n"
            "\tTo create a HydroPropFile, run the \"Hydro\" program.\n");
        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
      }

      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (sd = mol->beginIntegrableObject(j); sd != NULL;
             sd = mol->nextIntegrableObject(j)) {
          map<string, HydroProp*>::iterator iter =
              hydroPropMap_.find(sd->getType());
          if (iter != hydroPropMap_.end()) {
            hydroProps_.push_back(iter->second);
            moments_.push_back(getMomentData(sd));

          } else {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "Can not find resistance tensor for atom [%s]\n",
                     sd->getType().c_str());
            painCave.severity = OPENMD_ERROR;
            painCave.isFatal  = 1;
            simError();
          }
        }
      }

    } else {
      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (sd = mol->beginIntegrableObject(j); sd != NULL;
             sd = mol->nextIntegrableObject(j)) {
          Shape* currShape = NULL;

          if (sd->isAtom()) {
            Atom* atom          = static_cast<Atom*>(sd);
            AtomType* atomType  = atom->getAtomType();
            GayBerneAdapter gba = GayBerneAdapter(atomType);
            if (gba.isGayBerne()) {
              currShape = new Ellipsoid(V3Zero, gba.getL() / 2.0,
                                        gba.getD() / 2.0, Mat3x3d::identity());
            } else {
              LennardJonesAdapter lja = LennardJonesAdapter(atomType);
              if (lja.isLennardJones()) {
                currShape = new Sphere(V3Zero, lja.getSigma() / 2.0);
              } else {
                int aNum(0);
                vector<AtomType*> atChain = atomType->allYourBase();
                vector<AtomType*>::iterator i;
                for (i = atChain.begin(); i != atChain.end(); ++i) {
                  aNum = etab.GetAtomicNum((*i)->getName().c_str());
                  if (aNum != 0) {
                    currShape = new Sphere(V3Zero, etab.GetVdwRad(aNum));
                    break;
                  }
                }
                if (aNum == 0) {
                  snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                           "Could not find atom type in default element.txt\n");
                  painCave.severity = OPENMD_ERROR;
                  painCave.isFatal  = 1;
                  simError();
                }
              }
            }
          }

          if (!simParams_->haveTargetTemp()) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "You can't use LangevinDynamics without a targetTemp!\n");
            painCave.isFatal  = 1;
            painCave.severity = OPENMD_ERROR;
            simError();
          }

          if (!simParams_->haveViscosity()) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "You can't use LangevinDynamics without a viscosity!\n");
            painCave.isFatal  = 1;
            painCave.severity = OPENMD_ERROR;
            simError();
          }

          HydroProp* currHydroProp =
              currShape->getHydroProp(simParams_->getViscosity());
          map<string, HydroProp*>::iterator iter =
              hydroPropMap_.find(sd->getType());
          if (iter != hydroPropMap_.end()) {
            hydroProps_.push_back(iter->second);
            moments_.push_back(getMomentData(sd));

          } else {
            currHydroProp->complete();
            hydroPropMap_.insert(map<string, HydroProp*>::value_type(
                sd->getType(), currHydroProp));
            hydroProps_.push_back(currHydroProp);
            moments_.push_back(getMomentData(sd));
          }
          delete currShape;
        }
      }
    }

    RealType stdDev =
        std::sqrt(2.0 * Constants::kb * simParams_->getTargetTemp() / dt);

    forceDistribution_ = std::normal_distribution<RealType>(0.0, stdDev);
  }